

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory_p.h
# Opt level: O1

bool __thiscall
QSharedMemoryPrivate::tryLocker
          (QSharedMemoryPrivate *this,QSharedMemoryLocker *locker,QString *function)

{
  QArrayData *data;
  char16_t *pcVar1;
  qsizetype qVar2;
  bool bVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QAnyStringView a;
  QString local_60;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (locker->q_sm != (QSharedMemory *)0x0) {
    bVar3 = QSharedMemory::lock(locker->q_sm);
    bVar4 = true;
    if (bVar3) goto LAB_0021c81c;
  }
  locker->q_sm = (QSharedMemory *)0x0;
  bVar4 = false;
LAB_0021c81c:
  if (bVar4 == false) {
    QMetaObject::tr(&local_60,&QSharedMemory::staticMetaObject,"%1: unable to lock",(char *)0x0,-1);
    a.m_size = (function->d).size | 0x8000000000000000;
    a.field_0.m_data_utf16 = (function->d).ptr;
    QString::arg_impl(&local_48,&local_60,a,0,(QChar)0x20);
    data = &((this->errorString).d.d)->super_QArrayData;
    pcVar1 = (this->errorString).d.ptr;
    (this->errorString).d.d = local_48.d.d;
    (this->errorString).d.ptr = local_48.d.ptr;
    qVar2 = (this->errorString).d.size;
    (this->errorString).d.size = local_48.d.size;
    local_48.d.d = (Data *)data;
    local_48.d.ptr = pcVar1;
    local_48.d.size = qVar2;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
    this->error = LockError;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool tryLocker(QSharedMemoryLocker *locker, const QString &function) {
        if (!locker->lock()) {
            errorString = QSharedMemory::tr("%1: unable to lock").arg(function);
            error = QSharedMemory::LockError;
            return false;
        }
        return true;
    }